

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O0

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  CacheEntryType CVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  size_type sVar10;
  const_reference pvVar11;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pcVar12;
  char *pcVar13;
  long lVar14;
  cmState *this_00;
  char *pcVar15;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  byte local_22b;
  byte local_22a;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  char *local_1e0;
  char *existingValue;
  cmState *state;
  size_type cacheStart;
  string local_1c0;
  allocator local_199;
  string local_198;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_178;
  string local_168;
  uint local_144;
  char *pcStack_140;
  uint ignoreLastArgs;
  char *docstring;
  CacheEntryType type;
  bool parentScope;
  bool force;
  bool cache;
  string value;
  string local_108;
  allocator local_e1;
  string local_e0;
  undefined4 local_c0;
  byte local_b9;
  undefined1 local_b8 [7];
  bool currValueSet;
  string currValue;
  undefined1 local_90 [8];
  string putEnvArg;
  char *varName;
  char *variable;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmSetCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_007107a4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local,0);
  varName = (char *)std::__cxx11::string::c_str();
  bVar5 = cmHasLiteralPrefix<char_const*,5ul>(&varName,(char (*) [5])"ENV{");
  if ((!bVar5) || (sVar7 = strlen(varName), sVar7 < 6)) {
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
    pcVar13 = varName;
    if (sVar10 == 1) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,pcVar13,&local_e1);
      cmMakefile::RemoveDefinition(pcVar1,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      this_local._7_1_ = 1;
      goto LAB_007107a4;
    }
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
    pcVar4 = param_2_local;
    if (sVar10 == 2) {
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)pcVar4,sVar10 - 1);
      bVar5 = std::operator==(pvVar11,"PARENT_SCOPE");
      pcVar13 = varName;
      if (bVar5) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_108,pcVar13,(allocator *)(value.field_2._M_local_buf + 0xf));
        cmMakefile::RaiseScope(pcVar1,&local_108,(char *)0x0);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 1;
        goto LAB_007107a4;
      }
    }
    std::__cxx11::string::string((string *)&type);
    docstring._7_1_ = 0;
    docstring._6_1_ = 0;
    docstring._5_1_ = 0;
    docstring._0_4_ = STRING;
    pcStack_140 = (char *)0x0;
    local_144 = 0;
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
    pcVar4 = param_2_local;
    if (sVar10 < 2) {
LAB_0070ff23:
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
      pcVar4 = param_2_local;
      if (4 < sVar10) {
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)pcVar4,sVar10 - 1);
        bVar5 = std::operator==(pvVar11,"FORCE");
        if (bVar5) {
          docstring._6_1_ = 1;
          local_144 = local_144 + 1;
        }
      }
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
      pcVar4 = param_2_local;
      if (3 < sVar10) {
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)pcVar4,(sVar10 - (docstring._6_1_ & 1)) - 3);
        bVar5 = std::operator==(pvVar11,"CACHE");
        if (bVar5) {
          docstring._7_1_ = 1;
          local_144 = local_144 + 3;
        }
      }
    }
    else {
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)pcVar4,sVar10 - 1);
      bVar5 = std::operator==(pvVar11,"PARENT_SCOPE");
      if (!bVar5) goto LAB_0070ff23;
      docstring._5_1_ = 1;
      local_144 = local_144 + 1;
    }
    local_178 = cmMakeRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
    pcVar12 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_178,1);
    pcVar12 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::retreat(pcVar12,(ulong)local_144);
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_168,pcVar12,";");
    std::__cxx11::string::operator=((string *)&type,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    pcVar4 = param_2_local;
    pcVar13 = varName;
    if ((docstring._5_1_ & 1) == 0) {
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)pcVar4,sVar10 - 1);
      bVar5 = std::operator==(pvVar11,"CACHE");
      if (!bVar5) {
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
        pcVar4 = param_2_local;
        if (1 < sVar10) {
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local);
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)pcVar4,sVar10 - 2);
          bVar5 = std::operator==(pvVar11,"CACHE");
          if (bVar5) goto LAB_00710241;
        }
        if (((docstring._6_1_ & 1) == 0) || ((docstring._7_1_ & 1) != 0)) {
          if ((docstring._7_1_ & 1) != 0) {
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local);
            lVar14 = sVar10 - (docstring._6_1_ & 1);
            state = (cmState *)(lVar14 + -3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local,lVar14 - 2);
            pcVar13 = (char *)std::__cxx11::string::c_str();
            docstring._0_4_ = cmState::StringToCacheEntryType(pcVar13);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local,
                         (size_type)&(state->PropertyDefinitions)._M_t._M_impl.field_0x2);
            pcStack_140 = (char *)std::__cxx11::string::c_str();
          }
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar13 = varName;
          existingValue = (char *)this_00;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_200,pcVar13,&local_201);
          pcVar15 = cmState::GetCacheEntryValue(this_00,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator((allocator<char> *)&local_201);
          pcVar8 = varName;
          pcVar13 = existingValue;
          local_22a = 0;
          local_22b = 0;
          bVar5 = false;
          local_1e0 = pcVar15;
          if (pcVar15 != (char *)0x0) {
            std::allocator<char>::allocator();
            local_22a = 1;
            std::__cxx11::string::string((string *)&local_228,pcVar8,&local_229);
            local_22b = 1;
            CVar6 = cmState::GetCacheEntryType((cmState *)pcVar13,&local_228);
            bVar5 = CVar6 != UNINITIALIZED;
          }
          if ((local_22b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_228);
          }
          if ((local_22a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_229);
          }
          pcVar13 = varName;
          if ((((bVar5) && ((docstring._7_1_ & 1) != 0)) && ((CacheEntryType)docstring != INTERNAL))
             && ((docstring._6_1_ & 1) == 0)) {
            this_local._7_1_ = 1;
          }
          else {
            if ((docstring._7_1_ & 1) == 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_278,pcVar13,&local_279);
              pcVar13 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(pcVar1,&local_278,pcVar13);
              std::__cxx11::string::~string((string *)&local_278);
              std::allocator<char>::~allocator((allocator<char> *)&local_279);
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_250,pcVar13,&local_251);
              pcVar13 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddCacheDefinition
                        (pcVar1,&local_250,pcVar13,pcStack_140,(CacheEntryType)docstring,
                         (bool)(docstring._6_1_ & 1));
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator((allocator<char> *)&local_251);
            }
            this_local._7_1_ = 1;
          }
          goto LAB_00710788;
        }
      }
LAB_00710241:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c0,"given invalid arguments for CACHE mode.",
                 (allocator *)((long)&cacheStart + 7));
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cacheStart + 7));
      this_local._7_1_ = 0;
    }
    else {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,pcVar13,&local_199);
      pcVar13 = (char *)std::__cxx11::string::c_str();
      cmMakefile::RaiseScope(pcVar1,&local_198,pcVar13);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      this_local._7_1_ = 1;
    }
LAB_00710788:
    local_c0 = 1;
    std::__cxx11::string::~string((string *)&type);
    goto LAB_007107a4;
  }
  sVar7 = strlen(varName);
  pcVar13 = (char *)operator_new__(sVar7);
  pcVar8 = varName + 4;
  putEnvArg.field_2._8_8_ = pcVar13;
  sVar7 = strlen(varName);
  strncpy(pcVar13,pcVar8,sVar7 - 5);
  uVar2 = putEnvArg.field_2._8_8_;
  sVar7 = strlen(varName);
  uVar3 = putEnvArg.field_2._8_8_;
  *(undefined1 *)((sVar7 - 5) + uVar2) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,(char *)uVar3,(allocator *)(currValue.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(currValue.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=((string *)local_90,"=");
  std::__cxx11::string::string((string *)local_b8);
  local_b9 = cmsys::SystemTools::GetEnv((char *)putEnvArg.field_2._8_8_,(string *)local_b8);
  if (putEnvArg.field_2._8_8_ != 0) {
    operator_delete__((void *)putEnvArg.field_2._8_8_);
  }
  sVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)param_2_local);
  if (sVar10 < 2) {
LAB_0070fc33:
    if ((local_b9 & 1) != 0) {
      cmsys::SystemTools::PutEnv((string *)local_90);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local,1);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) != 0) goto LAB_0070fc33;
    if ((local_b9 & 1) == 0) {
LAB_0070fbaf:
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local,1);
      std::__cxx11::string::operator+=((string *)local_90,(string *)pvVar11);
      cmsys::SystemTools::PutEnv((string *)local_90);
    }
    else {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local,1);
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,pvVar11);
      if (bVar5) goto LAB_0070fbaf;
    }
  }
  this_local._7_1_ = 1;
  local_c0 = 1;
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_90);
LAB_007107a4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSetCommand::InitialPass(std::vector<std::string> const& args,
                               cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  const char* variable = args[0].c_str(); // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5) {
    // what is the variable name
    char* varName = new char[strlen(variable)];
    strncpy(varName, variable + 4, strlen(variable) - 5);
    varName[strlen(variable) - 5] = '\0';
    std::string putEnvArg = varName;
    putEnvArg += "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);
    delete[] varName;

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args[args.size() - 1] == "PARENT_SCOPE") {
    this->Makefile->RaiseScope(variable, CM_NULLPTR);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING;             // required if cache
  const char* docstring = CM_NULLPTR; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args[args.size() - 1] == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args[args.size() - 1] == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope) {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args[args.size() - 1] == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache)) {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    type = cmState::StringToCacheEntryType(args[cacheStart + 1].c_str());
    docstring = args[cacheStart + 2].c_str();
  }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    this->Makefile->AddCacheDefinition(variable, value.c_str(), docstring,
                                       type, force);
  } else {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
  }
  return true;
}